

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramUniformTests.cpp
# Opt level: O2

bool __thiscall
deqp::gles31::Functional::UniformAssignCase::test
          (UniformAssignCase *this,
          vector<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
          *basicUniforms,
          vector<deqp::gles31::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniformReportRef>_>
          *basicUniformReportsRef,ShaderProgram *program,Random *rnd)

{
  CallLogWrapper *this_00;
  long lVar1;
  int *piVar2;
  bool *pbVar3;
  GLuint program_00;
  uint uVar4;
  DataType DVar5;
  TestLog *pTVar6;
  TestLog *pTVar7;
  pointer pBVar8;
  pointer pVVar9;
  bool bVar10;
  GLint location;
  uint uVar11;
  deUint32 dVar12;
  GLenum GVar13;
  ulong uVar14;
  int line;
  ulong uVar15;
  VarValue *value_00;
  long lVar16;
  anon_union_64_5_83fd6269_for_val *paVar17;
  char *msg;
  pointer pBVar18;
  pointer pVVar19;
  float fVar20;
  float fVar21;
  long local_290;
  VarValue value;
  ScopedLogSection section_2;
  ScopedLogSection section;
  vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
  values;
  string local_1d0;
  GLint unit;
  undefined4 uStack_1ac;
  ostringstream local_1a8 [376];
  
  dVar12 = (program->m_program).m_program;
  pTVar6 = ((this->super_UniformCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&unit,"UniformAssign",(allocator<char> *)&local_1d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&value,"Uniform value assignments",(allocator<char> *)&values);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar6,(string *)&unit,(string *)&value);
  std::__cxx11::string::~string((string *)&value);
  std::__cxx11::string::~string((string *)&unit);
  UniformCase::assignUniforms(&this->super_UniformCase,basicUniforms,dVar12,rnd);
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  if (this->m_checkMethod == CHECKMETHOD_GET_UNIFORM) {
    values.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    values.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    values.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&unit,"GetUniforms",(allocator<char> *)&section);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&value,"Uniform value query",(allocator<char> *)&local_1d0);
    tcu::ScopedLogSection::ScopedLogSection(&section_2,pTVar6,(string *)&unit,(string *)&value);
    std::__cxx11::string::~string((string *)&value);
    std::__cxx11::string::~string((string *)&unit);
    program_00 = (program->m_program).m_program;
    pTVar7 = ((this->super_UniformCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
             m_log;
    this_00 = &(this->super_UniformCase).super_CallLogWrapper;
    bVar10 = true;
    for (lVar16 = 0;
        pBVar8 = (basicUniforms->
                 super__Vector_base<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
                 )._M_impl.super__Vector_impl_data._M_start,
        lVar16 < (int)(((long)(basicUniforms->
                              super__Vector_base<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pBVar8) / 0x98);
        lVar16 = lVar16 + 1) {
      pBVar18 = pBVar8 + lVar16;
      if ((((this->super_UniformCase).super_CallLogWrapper.field_0x15 & 1) == 0) ||
         (pBVar8[lVar16].elemNdx != 0)) {
        std::__cxx11::string::string((string *)&section,(string *)pBVar18);
      }
      else {
        beforeLast((string *)&section,&pBVar18->name,(char)this);
      }
      location = glu::CallLogWrapper::glGetUniformLocation
                           (this_00,program_00,(GLchar *)section.m_log);
      uVar11 = glu::getDataTypeScalarSize(pBVar18->type);
      value.val._44_8_ = 0xcdcdcdcdcdcdcdcd;
      value.val._52_8_ = 0xcdcdcdcdcdcdcdcd;
      value.val._28_8_ = 0xcdcdcdcdcdcdcdcd;
      value.val._36_8_ = 0xcdcdcdcdcdcdcdcd;
      value.val._12_8_ = 0xcdcdcdcdcdcdcdcd;
      value.val._20_8_ = 0xcdcdcdcdcdcdcdcd;
      value.val._4_8_ = 0xcdcdcdcdcdcdcdcd;
      value.val.floatV[0xf] = -4.3160208e+08;
      if (location == -1) {
        value._0_8_ = 0xcdcdcdcd00000000;
        std::
        vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
        ::push_back(&values,&value);
        if (pBVar18->isUsedInShader == true) {
          _unit = (pointer)pTVar7;
          std::__cxx11::ostringstream::ostringstream(local_1a8);
          std::operator<<((ostream *)local_1a8,"// FAILURE: ");
          std::operator<<((ostream *)local_1a8,(string *)pBVar18);
          std::operator<<((ostream *)local_1a8," was used in shader, but has location -1");
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)&unit,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(local_1a8);
          bVar10 = false;
        }
      }
      else {
        value.type = pBVar18->type;
        value.val.intV[0] = 0xcdcdcdcd;
        if ((value.type - TYPE_FLOAT < 4) ||
           (value.type - TYPE_FLOAT_MAT2 < 9 || value.type - TYPE_DOUBLE_MAT2 < 9)) {
          glu::CallLogWrapper::glGetUniformfv(this_00,program_00,location,value.val.floatV);
          dVar12 = glu::CallLogWrapper::glGetError(this_00);
          line = 0x51b;
          msg = "glGetUniformfv(programGL, location, &value.val.floatV[0])";
LAB_004efc06:
          glu::checkError(dVar12,msg,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                          ,line);
        }
        else {
          if (value.type - TYPE_INT < 4) {
            glu::CallLogWrapper::glGetUniformiv(this_00,program_00,location,value.val.intV);
            dVar12 = glu::CallLogWrapper::glGetError(this_00);
            line = 0x51d;
            msg = "glGetUniformiv(programGL, location, &value.val.intV[0])";
            goto LAB_004efc06;
          }
          if (value.type - TYPE_UINT < 4) {
            glu::CallLogWrapper::glGetUniformuiv(this_00,program_00,location,value.val.uintV);
            dVar12 = glu::CallLogWrapper::glGetError(this_00);
            line = 0x51f;
            msg = "glGetUniformuiv(programGL, location, &value.val.uintV[0])";
            goto LAB_004efc06;
          }
          if (value.type - TYPE_BOOL < 4) {
            uVar4 = *(uint *)&(this->super_UniformCase).super_CallLogWrapper.field_0x14;
            if ((uVar4 & 0x40) == 0) {
              if ((char)uVar4 < '\0') {
                glu::CallLogWrapper::glGetUniformuiv(this_00,program_00,location,value.val.uintV);
                GVar13 = glu::CallLogWrapper::glGetError(this_00);
                glu::checkError(GVar13,"glGetUniformuiv(programGL, location, &value.val.uintV[0])",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                                ,0x52a);
                if ((int)uVar11 < 1) {
                  uVar11 = 0;
                }
                for (uVar14 = 0; uVar11 != uVar14; uVar14 = uVar14 + 1) {
                  value.val.boolV[uVar14] = *(int *)((long)&value.val + uVar14 * 4) != 0;
                }
              }
              else {
                glu::CallLogWrapper::glGetUniformfv(this_00,program_00,location,value.val.floatV);
                GVar13 = glu::CallLogWrapper::glGetError(this_00);
                glu::checkError(GVar13,"glGetUniformfv(programGL, location, &value.val.floatV[0])",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                                ,0x530);
                if ((int)uVar11 < 1) {
                  uVar11 = 0;
                }
                for (uVar14 = 0; uVar11 != uVar14; uVar14 = uVar14 + 1) {
                  value.val.boolV[uVar14] = *(float *)((long)&value.val + uVar14 * 4) != 0.0;
                }
              }
            }
            else {
              glu::CallLogWrapper::glGetUniformiv(this_00,program_00,location,value.val.intV);
              GVar13 = glu::CallLogWrapper::glGetError(this_00);
              glu::checkError(GVar13,"glGetUniformiv(programGL, location, &value.val.intV[0])",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                              ,0x524);
              if ((int)uVar11 < 1) {
                uVar11 = 0;
              }
              for (uVar14 = 0; uVar11 != uVar14; uVar14 = uVar14 + 1) {
                value.val.boolV[uVar14] = *(int *)((long)&value.val + uVar14 * 4) != 0;
              }
            }
          }
          else if (value.type - TYPE_SAMPLER_1D < 0x1e) {
            unit = 0xffffffff;
            glu::CallLogWrapper::glGetUniformiv(this_00,program_00,location,&unit);
            GVar13 = glu::CallLogWrapper::glGetError(this_00);
            glu::checkError(GVar13,"glGetUniformiv(programGL, location, &unit)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                            ,0x538);
            value.val.intV[0] = unit;
          }
        }
        std::
        vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
        ::push_back(&values,&value);
        _unit = (pointer)pTVar7;
        std::__cxx11::ostringstream::ostringstream(local_1a8);
        std::operator<<((ostream *)local_1a8,"// Got ");
        std::operator<<((ostream *)local_1a8,(string *)pBVar18);
        std::operator<<((ostream *)local_1a8," value ");
        apiVarValueStr_abi_cxx11_(&local_1d0,(Functional *)&value,value_00);
        std::operator<<((ostream *)local_1a8,(string *)&local_1d0);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&unit,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::string::~string((string *)&local_1d0);
        std::__cxx11::ostringstream::~ostringstream(local_1a8);
      }
      std::__cxx11::string::~string((string *)&section);
    }
    tcu::ScopedLogSection::~ScopedLogSection(&section_2);
    if (bVar10) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&unit,"ValueCheck",(allocator<char> *)&local_1d0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&value,"Verify that the reported values match the assigned values",
                 (allocator<char> *)&section_2);
      tcu::ScopedLogSection::ScopedLogSection(&section,pTVar6,(string *)&unit,(string *)&value);
      std::__cxx11::string::~string((string *)&value);
      std::__cxx11::string::~string((string *)&unit);
      pVVar9 = values.
               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pTVar6 = ((this->super_UniformCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
               m_log;
      paVar17 = &(values.
                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                  ._M_impl.super__Vector_impl_data._M_start)->val;
      bVar10 = true;
      local_290 = 0x2c;
      for (lVar16 = 0;
          pBVar8 = (basicUniforms->
                   super__Vector_base<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
                   )._M_impl.super__Vector_impl_data._M_start,
          lVar16 < (int)(((long)(basicUniforms->
                                super__Vector_base<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)pBVar8) / 0x98);
          lVar16 = lVar16 + 1) {
        _unit = (pointer)pTVar6;
        std::__cxx11::ostringstream::ostringstream(local_1a8);
        std::operator<<((ostream *)local_1a8,"// Checking uniform ");
        pBVar18 = pBVar8 + lVar16;
        std::operator<<((ostream *)local_1a8,(string *)pBVar18);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&unit,(EndMessageToken *)&tcu::TestLog::EndMessage);
        pVVar19 = pVVar9 + lVar16;
        std::__cxx11::ostringstream::~ostringstream(local_1a8);
        if (pVVar19->type != TYPE_INVALID) {
          uVar11 = glu::getDataTypeScalarSize(pVVar19->type);
          DVar5 = pVVar19->type;
          if ((DVar5 - TYPE_FLOAT < 4) ||
             (DVar5 - TYPE_FLOAT_MAT2 < 9 || DVar5 - TYPE_DOUBLE_MAT2 < 9)) {
            uVar14 = (ulong)uVar11;
            if ((int)uVar11 < 1) {
              uVar14 = 0;
            }
            uVar15 = 0;
            do {
              if (uVar14 == uVar15) goto LAB_004f0195;
              fVar20 = paVar17->floatV[uVar15] -
                       *(float *)((long)&(pBVar8->name)._M_dataplus._M_p + uVar15 * 4 + local_290);
              fVar21 = -fVar20;
              if (-fVar20 <= fVar20) {
                fVar21 = fVar20;
              }
              uVar15 = uVar15 + 1;
            } while (fVar21 < 0.05);
          }
          else if (DVar5 - TYPE_INT < 4) {
            uVar14 = (ulong)uVar11;
            if ((int)uVar11 < 1) {
              uVar14 = 0;
            }
            uVar15 = 0;
            do {
              if (uVar14 == uVar15) goto LAB_004f0195;
              piVar2 = paVar17->intV + uVar15;
              lVar1 = uVar15 * 4;
              uVar15 = uVar15 + 1;
            } while (*piVar2 == *(int *)((long)&(pBVar8->name)._M_dataplus._M_p + lVar1 + local_290)
                    );
          }
          else if (DVar5 - TYPE_UINT < 4) {
            uVar14 = (ulong)uVar11;
            if ((int)uVar11 < 1) {
              uVar14 = 0;
            }
            uVar15 = 0;
            do {
              if (uVar14 == uVar15) goto LAB_004f0195;
              piVar2 = paVar17->intV + uVar15;
              lVar1 = uVar15 * 4;
              uVar15 = uVar15 + 1;
            } while (*piVar2 == *(int *)((long)&(pBVar8->name)._M_dataplus._M_p + lVar1 + local_290)
                    );
          }
          else if (DVar5 - TYPE_BOOL < 4) {
            uVar14 = (ulong)uVar11;
            if ((int)uVar11 < 1) {
              uVar14 = 0;
            }
            uVar15 = 0;
            do {
              if (uVar14 == uVar15) goto LAB_004f0195;
              pbVar3 = paVar17->boolV + uVar15;
              lVar1 = uVar15 + local_290;
              uVar15 = uVar15 + 1;
            } while (*pbVar3 == (bool)*(char *)((long)&(pBVar8->name)._M_dataplus._M_p + lVar1));
          }
          else if ((0x1d < DVar5 - TYPE_SAMPLER_1D) ||
                  ((pVVar19->val).intV[0] == (pBVar18->finalValue).val.intV[0])) goto LAB_004f0195;
          _unit = (pointer)pTVar6;
          std::__cxx11::ostringstream::ostringstream(local_1a8);
          std::operator<<((ostream *)local_1a8,
                          "// FAILURE: value obtained with glGetUniform*() for uniform ");
          std::operator<<((ostream *)local_1a8,(string *)pBVar18);
          std::operator<<((ostream *)local_1a8," differs from value set with glProgramUniform*()");
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)&unit,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(local_1a8);
          bVar10 = false;
        }
LAB_004f0195:
        local_290 = local_290 + 0x98;
        paVar17 = (anon_union_64_5_83fd6269_for_val *)((long)paVar17 + 0x44);
      }
      tcu::ScopedLogSection::~ScopedLogSection(&section);
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
      ::~vector(&values);
      if (bVar10) {
        return true;
      }
    }
    else {
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
      ::~vector(&values);
    }
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&unit,"RenderTest",(allocator<char> *)&local_1d0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&value,"Render test",(allocator<char> *)&values);
    tcu::ScopedLogSection::ScopedLogSection(&section,pTVar6,(string *)&unit,(string *)&value);
    std::__cxx11::string::~string((string *)&value);
    std::__cxx11::string::~string((string *)&unit);
    bVar10 = UniformCase::renderTest(&this->super_UniformCase,basicUniforms,program,rnd);
    tcu::ScopedLogSection::~ScopedLogSection(&section);
    if (bVar10) {
      return true;
    }
  }
  return false;
}

Assistant:

bool UniformAssignCase::test (const vector<BasicUniform>& basicUniforms, const vector<BasicUniformReportRef>& basicUniformReportsRef, const ShaderProgram& program, Random& rnd)
{
	DE_UNREF(basicUniformReportsRef);

	const deUint32	programGL	= program.getProgram();
	TestLog&		log			= m_testCtx.getLog();

	{
		const ScopedLogSection section(log, "UniformAssign", "Uniform value assignments");
		assignUniforms(basicUniforms, programGL, rnd);
	}

	if (m_checkMethod == CHECKMETHOD_GET_UNIFORM)
	{
		vector<VarValue> values;

		{
			const ScopedLogSection section(log, "GetUniforms", "Uniform value query");
			const bool success = getUniforms(values, basicUniforms, program.getProgram());

			if (!success)
				return false;
		}

		{
			const ScopedLogSection section(log, "ValueCheck", "Verify that the reported values match the assigned values");
			const bool success = compareUniformValues(values, basicUniforms);

			if (!success)
				return false;
		}
	}
	else
	{
		DE_ASSERT(m_checkMethod == CHECKMETHOD_RENDER);

		const ScopedLogSection section(log, "RenderTest", "Render test");
		const bool success = renderTest(basicUniforms, program, rnd);

		if (!success)
			return false;
	}

	return true;
}